

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_PPO_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  undefined8 in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  double *in_stack_00000008;
  int in_stack_00000014;
  int *in_stack_00000038;
  double *in_stack_00000040;
  
  TVar1 = TA_PPO((int)outNBElement,in_stack_00000014,in_stack_00000008,unaff_retaddr_00,
                 unaff_retaddr,(TA_MAType)((ulong)in_RDI >> 0x20),(int *)params,in_stack_00000038,
                 in_stack_00000040);
  return TVar1;
}

Assistant:

TA_RetCode TA_PPO_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_PPO(
/* Generated */             startIdx,
/* Generated */             endIdx,
/* Generated */             params->in[0].data.inReal, /* inReal */
/* Generated */             params->optIn[0].data.optInInteger, /* optInFastPeriod*/
/* Generated */             params->optIn[1].data.optInInteger, /* optInSlowPeriod*/
/* Generated */             (TA_MAType)params->optIn[2].data.optInInteger, /* optInMAType*/
/* Generated */             outBegIdx, 
/* Generated */             outNBElement, 
/* Generated */             params->out[0].data.outReal /*  outReal */ );
/* Generated */ }